

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::AttributeInstanceSyntax::getChild(AttributeInstanceSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff78;
  TokenOrSyntax *in_stack_ffffffffffffff80;
  nullptr_t in_stack_ffffffffffffff88;
  
  switch(in_RDX) {
  case 0:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token);
    break;
  case 1:
    token_00.info = in_RDI;
    token_00._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_00);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x38),in_stack_ffffffffffffff78);
    break;
  case 3:
    token_01.info = in_RDI;
    token_01._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_01);
    break;
  case 4:
    token_02.info = in_RDI;
    token_02._0_8_ = in_stack_ffffffffffffff88;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff80,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffff88);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax AttributeInstanceSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openParen;
        case 1: return openStar;
        case 2: return &specs;
        case 3: return closeStar;
        case 4: return closeParen;
        default: return nullptr;
    }
}